

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-client.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  ssize_t sVar6;
  char *local_2d8;
  char *hostname;
  char *servname;
  termios tios;
  addrinfo hints;
  addrinfo *ai;
  pollfd pfd [2];
  undefined1 local_230 [8];
  sockaddr_in addr;
  int sock;
  int rs;
  char buffer [512];
  char **argv_local;
  int argc_local;
  
  buffer._504_8_ = argv;
  if (argc < 2) {
    fprintf(_stderr,"Usage:\n ./telnet-client <host> [port]\n");
    argv_local._4_4_ = 1;
  }
  else {
    if (argc < 3) {
      local_2d8 = "23";
    }
    else {
      local_2d8 = argv[2];
    }
    pcVar5 = argv[1];
    memset(&tios.c_ispeed,0,0x30);
    tios.c_ospeed = 0;
    hints.ai_flags = 1;
    addr.sin_zero._4_4_ =
         getaddrinfo(pcVar5,local_2d8,(addrinfo *)&tios.c_ispeed,(addrinfo **)&hints.ai_next);
    pFVar1 = _stderr;
    if (addr.sin_zero._4_4_ == 0) {
      addr.sin_zero._0_4_ = socket(2,1,0);
      pFVar1 = _stderr;
      if (addr.sin_zero._0_4_ == -1) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar1,"socket() failed: %s\n",pcVar5);
        argv_local._4_4_ = 1;
      }
      else {
        memset(local_230,0,0x10);
        local_230._0_2_ = 2;
        iVar2 = bind(addr.sin_zero._0_4_,(sockaddr *)local_230,0x10);
        pFVar1 = _stderr;
        if (iVar2 == -1) {
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          fprintf(pFVar1,"bind() failed: %s\n",pcVar5);
          close(addr.sin_zero._0_4_);
          argv_local._4_4_ = 1;
        }
        else {
          iVar2 = connect(addr.sin_zero._0_4_,(sockaddr *)(hints.ai_next)->ai_addr,
                          (hints.ai_next)->ai_addrlen);
          pFVar1 = _stderr;
          if (iVar2 == -1) {
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            fprintf(pFVar1,"connect() failed: %s\n",pcVar5);
            close(addr.sin_zero._0_4_);
            argv_local._4_4_ = 1;
          }
          else {
            freeaddrinfo((addrinfo *)hints.ai_next);
            tcgetattr(1,(termios *)&orig_tios);
            atexit(_cleanup);
            memcpy((void *)((long)&servname + 4),&orig_tios,0x3c);
            cfmakeraw((termios *)((long)&servname + 4));
            tcsetattr(1,1,(termios *)((long)&servname + 4));
            do_echo = 1;
            telnet = telnet_init(telopts,_event_handler,'\0',addr.sin_zero);
            memset(&ai,0,0x10);
            ai._0_4_ = 0;
            ai._4_2_ = 1;
            pfd[0].fd._0_1_ = addr.sin_zero[0];
            pfd[0].fd._1_1_ = addr.sin_zero[1];
            pfd[0].fd._2_1_ = addr.sin_zero[2];
            pfd[0].fd._3_1_ = addr.sin_zero[3];
            pfd[0].events = 1;
            while (iVar2 = poll((pollfd *)&ai,2,-1), iVar2 != -1) {
              if ((ai._6_2_ & 0x19) != 0) {
                sVar6 = read(0,&sock,0x200);
                pFVar1 = _stderr;
                addr.sin_zero._4_4_ = SUB84(sVar6,0);
                if ((int)addr.sin_zero._4_4_ < 1) {
                  if (addr.sin_zero._4_4_ != 0) {
                    piVar4 = __errno_location();
                    pcVar5 = strerror(*piVar4);
                    fprintf(pFVar1,"recv(server) failed: %s\n",pcVar5);
                    exit(1);
                  }
                  break;
                }
                _input((char *)&sock,addr.sin_zero._4_4_);
              }
              if ((pfd[0].revents & 0x19U) != 0) {
                sVar6 = recv(addr.sin_zero._0_4_,&sock,0x200,0);
                pFVar1 = _stderr;
                addr.sin_zero._4_4_ = SUB84(sVar6,0);
                if ((int)addr.sin_zero._4_4_ < 1) {
                  if (addr.sin_zero._4_4_ != 0) {
                    piVar4 = __errno_location();
                    pcVar5 = strerror(*piVar4);
                    fprintf(pFVar1,"recv(client) failed: %s\n",pcVar5);
                    exit(1);
                  }
                  break;
                }
                telnet_recv(telnet,(char *)&sock,(long)(int)addr.sin_zero._4_4_);
              }
            }
            telnet_free(telnet);
            close(addr.sin_zero._0_4_);
            argv_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      pcVar3 = gai_strerror(addr.sin_zero._4_4_);
      fprintf(pFVar1,"getaddrinfo() failed for %s: %s\n",pcVar5,pcVar3);
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	char buffer[512];
	int rs;
	int sock;
	struct sockaddr_in addr;
	struct pollfd pfd[2];
	struct addrinfo *ai;
	struct addrinfo hints;
	struct termios tios;
	const char *servname;
	const char *hostname;

	/* check usage */
	if (argc < 2) {
		fprintf(stderr, "Usage:\n ./telnet-client <host> [port]\n");
		return 1;
	}

	/* process arguments */
	servname = (argc < 3) ? "23" : argv[2];
	hostname = argv[1];

	/* look up server host */
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	if ((rs = getaddrinfo(hostname, servname, &hints, &ai)) != 0) {
		fprintf(stderr, "getaddrinfo() failed for %s: %s\n", hostname,
				gai_strerror(rs));
		return 1;
	}
	
	/* create server socket */
	if ((sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
		fprintf(stderr, "socket() failed: %s\n", strerror(errno));
		return 1;
	}

	/* bind server socket */
	memset(&addr, 0, sizeof(addr));
	addr.sin_family = AF_INET;
	if (bind(sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
		fprintf(stderr, "bind() failed: %s\n", strerror(errno));
		close(sock);
		return 1;
	}

	/* connect */
	if (connect(sock, ai->ai_addr, ai->ai_addrlen) == -1) {
		fprintf(stderr, "connect() failed: %s\n", strerror(errno));
		close(sock);
		return 1;
	}

	/* free address lookup info */
	freeaddrinfo(ai);

	/* get current terminal settings, set raw mode, make sure we
	 * register atexit handler to restore terminal settings
	 */
	tcgetattr(STDOUT_FILENO, &orig_tios);
	atexit(_cleanup);
	tios = orig_tios;
	cfmakeraw(&tios);
	tcsetattr(STDOUT_FILENO, TCSADRAIN, &tios);

	/* set input echoing on by default */
	do_echo = 1;

	/* initialize telnet box */
	telnet = telnet_init(telopts, _event_handler, 0, &sock);

	/* initialize poll descriptors */
	memset(pfd, 0, sizeof(pfd));
	pfd[0].fd = STDIN_FILENO;
	pfd[0].events = POLLIN;
	pfd[1].fd = sock;
	pfd[1].events = POLLIN;

	/* loop while both connections are open */
	while (poll(pfd, 2, -1) != -1) {
		/* read from stdin */
		if (pfd[0].revents & (POLLIN | POLLERR | POLLHUP)) {
			if ((rs = read(STDIN_FILENO, buffer, sizeof(buffer))) > 0) {
				_input(buffer, rs);
			} else if (rs == 0) {
				break;
			} else {
				fprintf(stderr, "recv(server) failed: %s\n",
						strerror(errno));
				exit(1);
			}
		}

		/* read from client */
		if (pfd[1].revents & (POLLIN | POLLERR | POLLHUP)) {
			if ((rs = recv(sock, buffer, sizeof(buffer), 0)) > 0) {
				telnet_recv(telnet, buffer, rs);
			} else if (rs == 0) {
				break;
			} else {
				fprintf(stderr, "recv(client) failed: %s\n",
						strerror(errno));
				exit(1);
			}
		}
	}

	/* clean up */
	telnet_free(telnet);
	close(sock);

	return 0;
}